

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

bool __thiscall IR::Instr::CanAggregateByteCodeUsesAcrossInstr(Instr *this,Instr *instr)

{
  uint32 uVar1;
  uint32 uVar2;
  bool bVar3;
  
  if (((instr->m_kind < 7) && ((0x68U >> (instr->m_kind & 0x1f) & 1) != 0)) ||
     (instr->m_func != this->m_func)) {
    bVar3 = false;
  }
  else {
    uVar1 = GetByteCodeOffset(instr);
    if (uVar1 == 0xffffffff) {
      bVar3 = true;
    }
    else {
      uVar1 = GetByteCodeOffset(instr);
      uVar2 = GetByteCodeOffset(this);
      bVar3 = uVar1 == uVar2;
    }
  }
  return bVar3;
}

Assistant:

bool Instr::CanAggregateByteCodeUsesAcrossInstr(Instr * instr)
{
    return !instr->StartsBasicBlock() && 
        instr->m_func == this->m_func &&
        ((instr->GetByteCodeOffset() == Js::Constants::NoByteCodeOffset) ||
        (instr->GetByteCodeOffset() == this->GetByteCodeOffset()));
}